

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

bool __thiscall
Scine::Core::ModuleManager::Impl::has(Impl *this,string *interface,string *model,string *moduleName)

{
  pointer pcVar1;
  element_type *peVar2;
  pointer pLVar3;
  pointer psVar4;
  long *plVar5;
  size_t sVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  pointer pLVar10;
  LibraryAndModules *source;
  pointer psVar11;
  shared_ptr<Scine::Core::Module> *modulePtr;
  bool bVar12;
  string moduleNameLower;
  string modulePtrLower;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  locale local_a0 [8];
  long *local_98;
  size_t local_90;
  long local_88 [2];
  long *local_78;
  size_t local_70;
  long local_68 [2];
  string *local_58;
  string *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_58 = interface;
  local_50 = model;
  std::locale::locale((locale *)&local_78);
  pcVar1 = (moduleName->_M_dataplus)._M_p;
  local_98 = local_88;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_98,pcVar1,(locale *)&local_78,pcVar1 + moduleName->_M_string_length,
             (locale *)&local_78);
  std::locale::~locale((locale *)&local_78);
  if ((moduleName->_M_string_length == 0) ||
     (iVar9 = std::__cxx11::string::compare((char *)&local_98), iVar9 == 0)) {
    pLVar3 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar10 = (this->_sources).
                   super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                   ._M_impl.super__Vector_impl_data._M_start; pLVar10 != pLVar3;
        pLVar10 = pLVar10 + 1) {
      psVar4 = (pLVar10->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar11 = (pLVar10->modules).
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar4;
          psVar11 = psVar11 + 1) {
        peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        cVar8 = (**(code **)(*(long *)peVar2 + 0x20))(peVar2,local_58,local_50);
        if (cVar8 != '\0') {
          bVar12 = true;
          goto LAB_0010974a;
        }
      }
    }
    bVar12 = false;
  }
  else {
    pLVar10 = (this->_sources).
              super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar10 == local_48) {
      bVar12 = false;
    }
    else {
      do {
        psVar11 = (pLVar10->modules).
                  super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (pLVar10->modules).
                   super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_40 = pLVar10;
        if (psVar11 != local_38) {
          do {
            (**(code **)(*(long *)(psVar11->
                                  super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x10))((string *)&local_c0);
            std::locale::locale(local_a0);
            local_78 = local_68;
            std::__cxx11::string::
            _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                      ((string *)&local_78,local_c0,local_a0,local_b8 + (long)local_c0,local_a0);
            std::locale::~locale(local_a0);
            if (local_c0 != local_b0) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            sVar6 = local_90;
            plVar5 = local_98;
            if ((local_70 == local_90) &&
               ((local_70 == 0 || (iVar9 = bcmp(local_78,local_98,local_70), iVar9 == 0)))) {
LAB_00109681:
              peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              bVar7 = (**(code **)(*(long *)peVar2 + 0x20))(peVar2,local_58,local_50);
            }
            else {
              local_c0 = local_b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,plVar5,sVar6 + (long)plVar5);
              std::__cxx11::string::append((char *)&local_c0);
              plVar5 = local_c0;
              if (local_70 == local_b8) {
                if (local_70 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar9 = bcmp(local_78,local_c0,local_70);
                  bVar12 = iVar9 != 0;
                }
              }
              else {
                bVar12 = true;
              }
              if (plVar5 != local_b0) {
                operator_delete(plVar5,local_b0[0] + 1);
              }
              bVar7 = 5;
              if (!bVar12) goto LAB_00109681;
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
            if ((bVar7 != 5) && (bVar7 != 0)) {
              if ((bVar7 & 1) != 0) {
                bVar12 = true;
                goto LAB_0010974a;
              }
              break;
            }
            psVar11 = psVar11 + 1;
          } while (psVar11 != local_38);
        }
        pLVar10 = local_40 + 1;
      } while (pLVar10 != local_48);
      bVar12 = false;
    }
  }
LAB_0010974a:
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return bVar12;
}

Assistant:

bool has(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    // If the module name is specified, look in detailed fashion
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return true;
          }
        }
      }
      return false;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        if (modulePtr->has(interface, model)) {
          return true;
        }
      }
    }

    return false;
  }